

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking_hugeint.cpp
# Opt level: O2

void duckdb::HugeIntPacker::Pack(uhugeint_t *in,uint32_t *out,bitpacking_width_t width)

{
  uint64_t *puVar1;
  byte bVar2;
  int iVar3;
  uint64_t value;
  uint *puVar4;
  uint32_t uVar5;
  undefined7 in_register_00000011;
  uint8_t i_1;
  uint uVar6;
  uint uVar7;
  uhugeint_t *puVar8;
  long lVar9;
  uint8_t i;
  uint uVar10;
  ulong uVar11;
  uhugeint_t local_108;
  uhugeint_t local_f8;
  uhugeint_t local_e8;
  uint64_t local_d0;
  long local_c8;
  uhugeint_t local_c0;
  uhugeint_t *local_b0;
  uint *local_a8;
  uhugeint_t local_a0;
  undefined8 local_90;
  uhugeint_t local_88;
  uint64_t local_78;
  uint64_t uStack_70;
  uhugeint_t local_60;
  uhugeint_t local_50;
  uhugeint_t local_40;
  
  local_90 = CONCAT71(in_register_00000011,width);
  switch((uint)local_90 << 0x1b | (uint)local_90 >> 5) {
  case 0:
    break;
  case 1:
    for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 1) {
      uVar5 = uhugeint_t::operator_cast_to_unsigned_int(in);
      out[lVar9] = uVar5;
      in = in + 1;
    }
    break;
  case 2:
    for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 1) {
      uVar5 = uhugeint_t::operator_cast_to_unsigned_int(in);
      out[lVar9 * 2] = uVar5;
      uhugeint_t::uhugeint_t(&local_108,0x20);
      local_e8 = uhugeint_t::operator>>(in,&local_108);
      uVar5 = uhugeint_t::operator_cast_to_unsigned_int(&local_e8);
      out[lVar9 * 2 + 1] = uVar5;
      in = in + 1;
    }
    break;
  case 3:
    for (lVar9 = 8; lVar9 != 0x188; lVar9 = lVar9 + 0xc) {
      uVar5 = uhugeint_t::operator_cast_to_unsigned_int(in);
      *(uint32_t *)((long)out + lVar9 + -8) = uVar5;
      uhugeint_t::uhugeint_t(&local_108,0x20);
      local_e8 = uhugeint_t::operator>>(in,&local_108);
      uVar5 = uhugeint_t::operator_cast_to_unsigned_int(&local_e8);
      *(uint32_t *)((long)out + lVar9 + -4) = uVar5;
      uhugeint_t::uhugeint_t(&local_108,0x40);
      local_e8 = uhugeint_t::operator>>(in,&local_108);
      uVar5 = uhugeint_t::operator_cast_to_unsigned_int(&local_e8);
      *(uint32_t *)((long)out + lVar9) = uVar5;
      in = in + 1;
    }
    break;
  case 4:
    for (lVar9 = 0; lVar9 != 0x200; lVar9 = lVar9 + 0x10) {
      puVar8 = (uhugeint_t *)((long)&in->lower + lVar9);
      uVar5 = uhugeint_t::operator_cast_to_unsigned_int(puVar8);
      *(uint32_t *)((long)out + lVar9) = uVar5;
      uhugeint_t::uhugeint_t(&local_108,0x20);
      local_e8 = uhugeint_t::operator>>(puVar8,&local_108);
      uVar5 = uhugeint_t::operator_cast_to_unsigned_int(&local_e8);
      *(uint32_t *)((long)out + lVar9 + 4) = uVar5;
      uhugeint_t::uhugeint_t(&local_108,0x40);
      local_e8 = uhugeint_t::operator>>(puVar8,&local_108);
      uVar5 = uhugeint_t::operator_cast_to_unsigned_int(&local_e8);
      *(uint32_t *)((long)out + lVar9 + 8) = uVar5;
      uhugeint_t::uhugeint_t(&local_108,0x60);
      local_e8 = uhugeint_t::operator>>(puVar8,&local_108);
      uVar5 = uhugeint_t::operator_cast_to_unsigned_int(&local_e8);
      *(uint32_t *)((long)out + lVar9 + 0xc) = uVar5;
    }
    break;
  default:
    local_d0 = (uint64_t)width;
    uVar11 = 0;
    local_b0 = in;
    for (lVar9 = 0; value = local_d0, lVar9 != 0x1f0; lVar9 = lVar9 + 0x10) {
      puVar1 = (uint64_t *)((long)&in->lower + lVar9);
      local_78 = *puVar1;
      uStack_70 = puVar1[1];
      local_a8 = out;
      uhugeint_t::uhugeint_t(&local_40,1);
      uhugeint_t::uhugeint_t(&local_50,value);
      local_88 = uhugeint_t::operator<<(&local_40,&local_50);
      uhugeint_t::uhugeint_t(&local_60,1);
      local_c0 = uhugeint_t::operator-(&local_88,&local_60);
      puVar4 = local_a8;
      in = local_b0;
      local_e8.upper = uStack_70;
      local_e8.lower = local_78;
      uVar10 = (uint)uVar11;
      uVar6 = uVar10 & 0x1f;
      uVar7 = (int)local_90 + uVar6;
      if (uVar7 < 0x20) {
        if ((uVar11 & 0x1f) == 0) {
          local_108 = uhugeint_t::operator&(&local_e8,&local_c0);
          uVar5 = uhugeint_t::operator_cast_to_unsigned_int(&local_108);
          *local_a8 = uVar5;
          out = local_a8;
          in = local_b0;
        }
        else {
          local_f8 = uhugeint_t::operator&(&local_e8,&local_c0);
          uhugeint_t::uhugeint_t(&local_a0,(ulong)(uVar10 & 0x1f));
          local_108 = uhugeint_t::operator<<(&local_f8,&local_a0);
          uVar5 = uhugeint_t::operator_cast_to_unsigned_int(&local_108);
          *local_a8 = *local_a8 | uVar5;
          out = local_a8;
          in = local_b0;
        }
      }
      else {
        local_c8 = lVar9;
        if (uVar7 < 0x40) {
          if ((uVar11 & 0x1f) == 0) {
            local_108 = uhugeint_t::operator&(&local_e8,&local_c0);
            uVar5 = uhugeint_t::operator_cast_to_unsigned_int(&local_108);
            *puVar4 = uVar5;
          }
          else {
            local_f8 = uhugeint_t::operator&(&local_e8,&local_c0);
            uhugeint_t::uhugeint_t(&local_a0,(ulong)(uVar10 & 0x1f));
            local_108 = uhugeint_t::operator<<(&local_f8,&local_a0);
            uVar5 = uhugeint_t::operator_cast_to_unsigned_int(&local_108);
            *puVar4 = *puVar4 | uVar5;
          }
          in = local_b0;
          out = puVar4 + 1;
          lVar9 = local_c8;
          if (uVar7 != 0x20) {
            local_f8 = uhugeint_t::operator&(&local_e8,&local_c0);
            uVar6 = 0x20 - uVar6;
LAB_01a20f5f:
            uhugeint_t::uhugeint_t(&local_a0,(ulong)uVar6);
LAB_01a20f6f:
            local_108 = uhugeint_t::operator>>(&local_f8,&local_a0);
            uVar5 = uhugeint_t::operator_cast_to_unsigned_int(&local_108);
            *out = uVar5;
            lVar9 = local_c8;
          }
        }
        else if (uVar7 < 0x60) {
          if ((uVar11 & 0x1f) == 0) {
            local_108 = uhugeint_t::operator&(&local_e8,&local_c0);
            uVar5 = uhugeint_t::operator_cast_to_unsigned_int(&local_108);
            *puVar4 = uVar5;
          }
          else {
            uhugeint_t::uhugeint_t(&local_f8,(ulong)(uVar10 & 0x1f));
            local_108 = uhugeint_t::operator<<(&local_e8,&local_f8);
            uVar5 = uhugeint_t::operator_cast_to_unsigned_int(&local_108);
            *puVar4 = *puVar4 | uVar5;
          }
          local_f8 = uhugeint_t::operator&(&local_e8,&local_c0);
          uhugeint_t::uhugeint_t(&local_a0,(ulong)(0x20 - uVar6));
          local_108 = uhugeint_t::operator>>(&local_f8,&local_a0);
          uVar5 = uhugeint_t::operator_cast_to_unsigned_int(&local_108);
          puVar4[1] = uVar5;
          out = puVar4 + 2;
          lVar9 = local_c8;
          if (uVar7 != 0x40) {
            local_f8 = uhugeint_t::operator&(&local_e8,&local_c0);
            iVar3 = 0x40;
LAB_01a20f5c:
            uVar6 = iVar3 - uVar6;
            goto LAB_01a20f5f;
          }
        }
        else if (uVar7 < 0x80) {
          if ((uVar11 & 0x1f) == 0) {
            local_108 = uhugeint_t::operator&(&local_e8,&local_c0);
            uVar5 = uhugeint_t::operator_cast_to_unsigned_int(&local_108);
            *puVar4 = uVar5;
          }
          else {
            uhugeint_t::uhugeint_t(&local_f8,(ulong)(uVar10 & 0x1f));
            local_108 = uhugeint_t::operator<<(&local_e8,&local_f8);
            uVar5 = uhugeint_t::operator_cast_to_unsigned_int(&local_108);
            *puVar4 = *puVar4 | uVar5;
          }
          local_f8 = uhugeint_t::operator&(&local_e8,&local_c0);
          uhugeint_t::uhugeint_t(&local_a0,(ulong)(0x20 - uVar6));
          local_108 = uhugeint_t::operator>>(&local_f8,&local_a0);
          uVar5 = uhugeint_t::operator_cast_to_unsigned_int(&local_108);
          puVar4[1] = uVar5;
          local_f8 = uhugeint_t::operator&(&local_e8,&local_c0);
          uhugeint_t::uhugeint_t(&local_a0,(ulong)(0x40 - uVar6));
          local_108 = uhugeint_t::operator>>(&local_f8,&local_a0);
          uVar5 = uhugeint_t::operator_cast_to_unsigned_int(&local_108);
          puVar4[2] = uVar5;
          out = puVar4 + 3;
          lVar9 = local_c8;
          if (uVar7 != 0x60) {
            local_f8 = uhugeint_t::operator&(&local_e8,&local_c0);
            iVar3 = 0x60;
            goto LAB_01a20f5c;
          }
        }
        else {
          uhugeint_t::uhugeint_t(&local_f8,(ulong)(uVar10 & 0x1f));
          local_108 = uhugeint_t::operator<<(&local_e8,&local_f8);
          uVar5 = uhugeint_t::operator_cast_to_unsigned_int(&local_108);
          *puVar4 = *puVar4 | uVar5;
          local_f8 = uhugeint_t::operator&(&local_e8,&local_c0);
          uhugeint_t::uhugeint_t(&local_a0,(ulong)(0x20 - uVar6));
          local_108 = uhugeint_t::operator>>(&local_f8,&local_a0);
          uVar5 = uhugeint_t::operator_cast_to_unsigned_int(&local_108);
          puVar4[1] = uVar5;
          local_f8 = uhugeint_t::operator&(&local_e8,&local_c0);
          uhugeint_t::uhugeint_t(&local_a0,(ulong)(0x40 - uVar6));
          local_108 = uhugeint_t::operator>>(&local_f8,&local_a0);
          uVar5 = uhugeint_t::operator_cast_to_unsigned_int(&local_108);
          puVar4[2] = uVar5;
          local_f8 = uhugeint_t::operator&(&local_e8,&local_c0);
          uhugeint_t::uhugeint_t(&local_a0,(ulong)(0x60 - uVar6));
          local_108 = uhugeint_t::operator>>(&local_f8,&local_a0);
          uVar5 = uhugeint_t::operator_cast_to_unsigned_int(&local_108);
          puVar4[3] = uVar5;
          out = puVar4 + 4;
          lVar9 = local_c8;
          if (uVar7 != 0x80) {
            local_f8 = uhugeint_t::operator&(&local_e8,&local_c0);
            uhugeint_t::uhugeint_t(&local_a0,(ulong)(0x80 - uVar6));
            goto LAB_01a20f6f;
          }
        }
      }
      uVar11 = uVar11 + local_d0;
    }
    bVar2 = (byte)local_90;
    puVar8 = in + 0x1f;
    uhugeint_t::uhugeint_t(&local_108,(ulong)(-bVar2 & 0x1f));
    local_e8 = uhugeint_t::operator<<(puVar8,&local_108);
    uVar5 = uhugeint_t::operator_cast_to_unsigned_int(&local_e8);
    *out = *out | uVar5;
    if (0x20 < bVar2) {
      uVar6 = (uint)(-bVar2 & 0x1f);
      uhugeint_t::uhugeint_t(&local_108,(ulong)(0x20 - uVar6));
      local_e8 = uhugeint_t::operator>>(puVar8,&local_108);
      uVar5 = uhugeint_t::operator_cast_to_unsigned_int(&local_e8);
      out[1] = uVar5;
      if (0x40 < bVar2) {
        uhugeint_t::uhugeint_t(&local_108,(ulong)(0x40 - uVar6));
        local_e8 = uhugeint_t::operator>>(puVar8,&local_108);
        uVar5 = uhugeint_t::operator_cast_to_unsigned_int(&local_e8);
        out[2] = uVar5;
        if (0x60 < bVar2) {
          uhugeint_t::uhugeint_t(&local_108,(ulong)(0x60 - uVar6));
          local_e8 = uhugeint_t::operator>>(puVar8,&local_108);
          uVar5 = uhugeint_t::operator_cast_to_unsigned_int(&local_e8);
          out[3] = uVar5;
        }
      }
    }
  }
  return;
}

Assistant:

void HugeIntPacker::Pack(const uhugeint_t *__restrict in, uint32_t *__restrict out, bitpacking_width_t width) {
	D_ASSERT(width <= 128);
	switch (width) {
	case 0:
		break;
	case 32:
		PackDelta32(in, out);
		break;
	case 64:
		PackDelta64(in, out);
		break;
	case 96:
		PackDelta96(in, out);
		break;
	case 128:
		PackDelta128(in, out);
		break;
	default:
		for (idx_t oindex = 0; oindex < BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE - 1; ++oindex) {
			PackSingle(in[oindex], out, width, (width * oindex) % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE,
			           (uhugeint_t(1) << width) - 1);
		}
		PackLast(in, out, width);
	}
}